

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

int __thiscall
google::protobuf::Reflection::FieldSize(Reflection *this,Message *message,FieldDescriptor *field)

{
  byte bVar1;
  uint32_t uVar2;
  int iVar3;
  CppStringType CVar4;
  SooRep *this_00;
  MapFieldBase *this_01;
  RepeatedPtrFieldBase *pRVar5;
  Nonnull<const_char_*> pcVar6;
  bool bVar7;
  char *description;
  Descriptor *pDVar8;
  Metadata MVar9;
  LogMessage LStack_28;
  
  MVar9 = Message::GetMetadata(message);
  if (MVar9.reflection != this) {
    pDVar8 = this->descriptor_;
    MVar9 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar8,MVar9.descriptor,field,"FieldSize");
  }
  pDVar8 = this->descriptor_;
  if (field->containing_type_ == pDVar8) {
    bVar1 = field->field_0x1;
    bVar7 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar7) {
      pcVar6 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar6 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar7,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar6 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) != 0) {
        if ((field->field_0x1 & 8) != 0) {
          uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          iVar3 = internal::ExtensionSet::ExtensionSize
                            ((ExtensionSet *)
                             ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                             field->number_);
          return iVar3;
        }
        switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4)) {
        case 1:
        case 8:
          this_00 = &GetRaw<google::protobuf::RepeatedField<int>>(this,message,field)->soo_rep_;
          break;
        case 2:
          this_00 = &GetRaw<google::protobuf::RepeatedField<long>>(this,message,field)->soo_rep_;
          break;
        case 3:
          this_00 = &GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field)->
                     soo_rep_;
          break;
        case 4:
          this_00 = &GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field)->
                     soo_rep_;
          break;
        case 5:
          this_00 = &GetRaw<google::protobuf::RepeatedField<double>>(this,message,field)->soo_rep_;
          break;
        case 6:
          this_00 = &GetRaw<google::protobuf::RepeatedField<float>>(this,message,field)->soo_rep_;
          break;
        case 7:
          this_00 = &GetRaw<google::protobuf::RepeatedField<bool>>(this,message,field)->soo_rep_;
          break;
        case 9:
          CVar4 = FieldDescriptor::cpp_string_type(field);
          if (CVar4 != kCord) goto switchD_0042015a_caseD_a;
          this_00 = &GetRaw<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
                               (this,message,field)->soo_rep_;
          break;
        case 10:
switchD_0042015a_caseD_a:
          if ((field->type_ == '\v') && (bVar7 = FieldDescriptor::is_map_message_type(field), bVar7)
             ) {
            this_01 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
            bVar7 = internal::MapFieldBase::IsRepeatedFieldValid(this_01);
            if (!bVar7) {
              iVar3 = internal::MapFieldBase::size(this_01);
              return iVar3;
            }
            pRVar5 = internal::MapFieldBase::GetRepeatedField(this_01);
          }
          else {
            pRVar5 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
          }
          return pRVar5->current_size_;
        default:
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&LStack_28,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                     ,0x5ab);
          absl::lts_20250127::log_internal::LogMessage::operator<<
                    (&LStack_28,(char (*) [16])"Can\'t get here.");
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&LStack_28);
        }
        iVar3 = internal::SooRep::size
                          (this_00,(undefined1  [16])
                                   ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                                   (undefined1  [16])0x0);
        return iVar3;
      }
    }
    else {
      FieldSize();
    }
    pDVar8 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar8,field,"FieldSize",description);
}

Assistant:

int Reflection::FieldSize(const Message& message,
                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE(FieldSize, &message);
  USAGE_CHECK_MESSAGE_TYPE(FieldSize);
  USAGE_CHECK_REPEATED(FieldSize);

  if (field->is_extension()) {
    return GetExtensionSet(message).ExtensionSize(field->number());
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)    \
  case FieldDescriptor::CPPTYPE_##UPPERCASE: \
    return GetRaw<RepeatedField<LOWERCASE> >(message, field).size()

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          return GetRaw<RepeatedField<absl::Cord> >(message, field).size();
        }
        ABSL_FALLTHROUGH_INTENDED;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          const internal::MapFieldBase& map =
              GetRaw<MapFieldBase>(message, field);
          if (map.IsRepeatedFieldValid()) {
            return map.GetRepeatedField().size();
          } else {
            // No need to materialize the repeated field if it is out of sync:
            // its size will be the same as the map's size.
            return map.size();
          }
        } else {
          return GetRaw<RepeatedPtrFieldBase>(message, field).size();
        }
    }

    ABSL_LOG(FATAL) << "Can't get here.";
    return 0;
  }
}